

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

void double_jacobian_default
               (tc_uECC_word_t *X1,tc_uECC_word_t *Y1,tc_uECC_word_t *Z1,tc_uECC_Curve curve)

{
  char num_words_00;
  tc_uECC_word_t tVar1;
  tc_uECC_word_t l_carry;
  wordcount_t num_words;
  tc_uECC_word_t t5 [8];
  tc_uECC_word_t t4 [8];
  tc_uECC_Curve curve_local;
  tc_uECC_word_t *Z1_local;
  tc_uECC_word_t *Y1_local;
  tc_uECC_word_t *X1_local;
  
  num_words_00 = curve->num_words;
  tVar1 = tc_uECC_vli_isZero(Z1,num_words_00);
  if (tVar1 == 0) {
    tc_uECC_vli_modSquare_fast(t5 + 6,Y1,curve);
    tc_uECC_vli_modMult_fast(&l_carry,X1,t5 + 6,curve);
    tc_uECC_vli_modSquare_fast(t5 + 6,t5 + 6,curve);
    tc_uECC_vli_modMult_fast(Y1,Y1,Z1,curve);
    tc_uECC_vli_modSquare_fast(Z1,Z1,curve);
    tc_uECC_vli_modAdd(X1,X1,Z1,curve->p,num_words_00);
    tc_uECC_vli_modAdd(Z1,Z1,Z1,curve->p,num_words_00);
    tc_uECC_vli_modSub(Z1,X1,Z1,curve->p,num_words_00);
    tc_uECC_vli_modMult_fast(X1,X1,Z1,curve);
    tc_uECC_vli_modAdd(Z1,X1,X1,curve->p,num_words_00);
    tc_uECC_vli_modAdd(X1,X1,Z1,curve->p,num_words_00);
    tVar1 = tc_uECC_vli_testBit(X1,0);
    if (tVar1 == 0) {
      tc_uECC_vli_rshift1(X1,num_words_00);
    }
    else {
      tVar1 = tc_uECC_vli_add(X1,X1,curve->p,num_words_00);
      tc_uECC_vli_rshift1(X1,num_words_00);
      X1[num_words_00 + -1] = tVar1 << 0x1f | X1[num_words_00 + -1];
    }
    tc_uECC_vli_modSquare_fast(Z1,X1,curve);
    tc_uECC_vli_modSub(Z1,Z1,&l_carry,curve->p,num_words_00);
    tc_uECC_vli_modSub(Z1,Z1,&l_carry,curve->p,num_words_00);
    tc_uECC_vli_modSub(&l_carry,&l_carry,Z1,curve->p,num_words_00);
    tc_uECC_vli_modMult_fast(X1,X1,&l_carry,curve);
    tc_uECC_vli_modSub(t5 + 6,X1,t5 + 6,curve->p,num_words_00);
    tc_uECC_vli_set(X1,Z1,num_words_00);
    tc_uECC_vli_set(Z1,Y1,num_words_00);
    tc_uECC_vli_set(Y1,t5 + 6,num_words_00);
  }
  return;
}

Assistant:

void double_jacobian_default(tc_uECC_word_t * X1, tc_uECC_word_t * Y1,
			     tc_uECC_word_t * Z1, tc_uECC_Curve curve)
{
	/* t1 = X, t2 = Y, t3 = Z */
	tc_uECC_word_t t4[NUM_ECC_WORDS];
	tc_uECC_word_t t5[NUM_ECC_WORDS];
	wordcount_t num_words = curve->num_words;

	if (tc_uECC_vli_isZero(Z1, num_words)) {
		return;
	}

	tc_uECC_vli_modSquare_fast(t4, Y1, curve);   /* t4 = y1^2 */
	tc_uECC_vli_modMult_fast(t5, X1, t4, curve); /* t5 = x1*y1^2 = A */
	tc_uECC_vli_modSquare_fast(t4, t4, curve);   /* t4 = y1^4 */
	tc_uECC_vli_modMult_fast(Y1, Y1, Z1, curve); /* t2 = y1*z1 = z3 */
	tc_uECC_vli_modSquare_fast(Z1, Z1, curve);   /* t3 = z1^2 */

	tc_uECC_vli_modAdd(X1, X1, Z1, curve->p, num_words); /* t1 = x1 + z1^2 */
	tc_uECC_vli_modAdd(Z1, Z1, Z1, curve->p, num_words); /* t3 = 2*z1^2 */
	tc_uECC_vli_modSub(Z1, X1, Z1, curve->p, num_words); /* t3 = x1 - z1^2 */
	tc_uECC_vli_modMult_fast(X1, X1, Z1, curve); /* t1 = x1^2 - z1^4 */

	tc_uECC_vli_modAdd(Z1, X1, X1, curve->p, num_words); /* t3 = 2*(x1^2 - z1^4) */
	tc_uECC_vli_modAdd(X1, X1, Z1, curve->p, num_words); /* t1 = 3*(x1^2 - z1^4) */
	if (tc_uECC_vli_testBit(X1, 0)) {
		tc_uECC_word_t l_carry = tc_uECC_vli_add(X1, X1, curve->p, num_words);
		tc_uECC_vli_rshift1(X1, num_words);
		X1[num_words - 1] |= l_carry << (tc_uECC_WORD_BITS - 1);
	} else {
		tc_uECC_vli_rshift1(X1, num_words);
	}

	/* t1 = 3/2*(x1^2 - z1^4) = B */
	tc_uECC_vli_modSquare_fast(Z1, X1, curve); /* t3 = B^2 */
	tc_uECC_vli_modSub(Z1, Z1, t5, curve->p, num_words); /* t3 = B^2 - A */
	tc_uECC_vli_modSub(Z1, Z1, t5, curve->p, num_words); /* t3 = B^2 - 2A = x3 */
	tc_uECC_vli_modSub(t5, t5, Z1, curve->p, num_words); /* t5 = A - x3 */
	tc_uECC_vli_modMult_fast(X1, X1, t5, curve); /* t1 = B * (A - x3) */
	/* t4 = B * (A - x3) - y1^4 = y3: */
	tc_uECC_vli_modSub(t4, X1, t4, curve->p, num_words);

	tc_uECC_vli_set(X1, Z1, num_words);
	tc_uECC_vli_set(Z1, Y1, num_words);
	tc_uECC_vli_set(Y1, t4, num_words);
}